

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidIOS13LayerOldRank(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  ErfLayerParams *this_02;
  ostream *poVar8;
  int iVar9;
  Rep *pRVar10;
  int iVar11;
  Result res;
  Model m;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
    pFVar6 = pTVar5->type_;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  this = &pAVar7->shape_;
  iVar11 = (pAVar7->shape_).current_size_;
  iVar9 = (pAVar7->shape_).total_size_;
  if (iVar11 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
    iVar11 = (pAVar7->shape_).current_size_;
    iVar9 = (pAVar7->shape_).total_size_;
  }
  pRVar10 = (pAVar7->shape_).rep_;
  iVar3 = iVar11 + 1;
  (pAVar7->shape_).current_size_ = iVar3;
  pRVar10->elements[iVar11] = 1;
  if (iVar3 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 2);
    iVar3 = (pAVar7->shape_).current_size_;
    iVar9 = (pAVar7->shape_).total_size_;
    pRVar10 = (pAVar7->shape_).rep_;
  }
  iVar11 = iVar3 + 1;
  this->current_size_ = iVar11;
  pRVar10->elements[iVar3] = 2;
  if (iVar11 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar3 + 2);
    iVar11 = (pAVar7->shape_).current_size_;
    iVar9 = (pAVar7->shape_).total_size_;
    pRVar10 = (pAVar7->shape_).rep_;
  }
  iVar3 = iVar11 + 1;
  this->current_size_ = iVar3;
  pRVar10->elements[iVar11] = 1;
  if (iVar3 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 2);
    iVar3 = (pAVar7->shape_).current_size_;
    pRVar10 = (pAVar7->shape_).rep_;
  }
  this->current_size_ = iVar3 + 1;
  pRVar10->elements[iVar3] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"erf","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_01->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"B");
  if (this_01->_oneof_case_[0] != 0x316) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x316;
    this_02 = (ErfLayerParams *)operator_new(0x18);
    CoreML::Specification::ErfLayerParams::ErfLayerParams(this_02);
    (this_01->layer_).erf_ = this_02;
  }
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar2 = CoreML::Result::good((Result *)local_78);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x13a7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar2;
}

Assistant:

int testInvalidIOS13LayerOldRank() {
    /*
     a new layer, added in iOS 13 is used along with the old rank 5 mapping: not allowed.
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(2);
    shape->add_shape(1);
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m.mutable_neuralnetwork();
   
    auto *l = nn->add_layers();
    l->set_name("erf");
    l->add_input("A");
    l->add_output("B");
    l->mutable_erf();
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}